

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_field_mask_field
          (OneofWellKnownTypes *this,FieldMask *field_mask_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  FieldMask *field_mask_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (field_mask_field != (FieldMask *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)field_mask_field);
    message_arena = (Arena *)field_mask_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::FieldMask>
                              (message_arena_00,field_mask_field,submessage_arena_00);
    }
    set_has_field_mask_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_field_mask_field(::google::protobuf::FieldMask* PROTOBUF_NULLABLE field_mask_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (field_mask_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(field_mask_field)->GetArena();
    if (message_arena != submessage_arena) {
      field_mask_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, field_mask_field, submessage_arena);
    }
    set_has_field_mask_field();
    _impl_.oneof_field_.field_mask_field_ = field_mask_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.field_mask_field)
}